

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O2

int av1_compute_q_from_energy_level_deltaq_mode(AV1_COMP *cpi,int block_var_level)

{
  int qindex;
  int iVar1;
  int iVar2;
  
  qindex = (cpi->common).quant_params.base_qindex;
  iVar2 = av1_compute_qdelta_by_rate
                    (cpi,(cpi->common).current_frame.frame_type,qindex,
                     deltaq_rate_ratio[segment_id[(long)block_var_level + 4]]);
  iVar1 = 1 - qindex;
  if (qindex + iVar2 != 0) {
    iVar1 = iVar2;
  }
  if (qindex != 0) {
    iVar2 = iVar1;
  }
  return iVar2 + qindex;
}

Assistant:

int av1_compute_q_from_energy_level_deltaq_mode(const AV1_COMP *const cpi,
                                                int block_var_level) {
  int rate_level;
  const AV1_COMMON *const cm = &cpi->common;

  if (DELTA_Q_PERCEPTUAL_MODULATION == 1) {
    ENERGY_IN_BOUNDS(block_var_level);
    rate_level = SEGMENT_ID(block_var_level);
  } else {
    rate_level = block_var_level;
  }
  const int base_qindex = cm->quant_params.base_qindex;
  int qindex_delta =
      av1_compute_qdelta_by_rate(cpi, cm->current_frame.frame_type, base_qindex,
                                 deltaq_rate_ratio[rate_level]);

  if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
    qindex_delta = -base_qindex + 1;
  }
  return base_qindex + qindex_delta;
}